

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O3

void lts2::PerformRIHTOnImageFAST
               (Mat *anImage,Size *patchSize,LBDOperator *LBD,Mat *result,int iterations,
               float sparsity,float patchMean)

{
  int iVar1;
  int iVar2;
  LBDOperator *LBD_00;
  _InputArray *p_Var3;
  undefined8 uVar4;
  int iVar5;
  pointer pKVar6;
  pointer pKVar7;
  float fVar8;
  float fVar9;
  Rect ROI;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> fastPoints;
  Mat target;
  Mat ocount;
  Mat inputPatch;
  Mat resultPatch;
  Mat freak;
  Mat patchOnes;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  undefined1 local_448 [16];
  pointer local_438;
  _OutputArray local_430;
  _InputArray local_418;
  LBDOperator *local_400;
  Size local_3f8;
  _InputArray local_3f0 [4];
  string local_390 [3];
  Size local_330;
  undefined8 local_328;
  undefined8 local_320;
  _InputArray local_318 [4];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [6] [16];
  Mat local_248 [96];
  Mat local_1e8 [152];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  if ((*(uint *)anImage & 0xfff) == 5) {
    local_448 = (undefined1  [16])0x0;
    local_438 = (pointer)0x0;
    ExtractFastKeypoints(anImage,(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_448);
    local_320 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    cv::Mat::create(result,&local_320,5);
    local_318[0].obj = local_2b8;
    local_2a8[0] = (undefined1  [16])0x0;
    local_2b8 = (undefined1  [16])0x0;
    local_318[0].flags = -0x3efdfffa;
    local_318[0].sz = (Size)&DAT_400000001;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,local_318);
    local_328 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    local_2a8[0] = (undefined1  [16])0x0;
    local_2b8 = (undefined1  [16])0x0;
    cv::Mat::Mat((Mat *)local_318,&local_328,5);
    local_330 = *patchSize;
    cv::Mat::ones(local_2b8,&local_330,5);
    local_400 = LBD;
    cv::Mat::Mat(local_90);
    (**(code **)(*(long *)local_2b8._0_8_ + 0x18))(local_2b8._0_8_,local_2b8,local_90,0xffffffff);
    cv::Mat::~Mat(local_1e8);
    cv::Mat::~Mat(local_248);
    cv::Mat::~Mat((Mat *)local_2a8);
    cv::Mat::Mat((Mat *)local_2b8);
    cv::Mat::Mat(local_f0);
    cv::Mat::Mat(local_150);
    if (local_448._0_8_ != local_448._8_8_) {
      iVar1 = patchSize->width;
      iVar2 = patchSize->height;
      pKVar6 = (pointer)local_448._8_8_;
      pKVar7 = (pointer)local_448._0_8_;
      do {
        fVar9 = *(float *)(pKVar7 + 4);
        fVar8 = rintf(*(float *)pKVar7);
        iVar5 = (int)fVar8 - iVar1 / 2;
        fVar9 = rintf(fVar9);
        local_454 = (int)fVar9 - iVar2 / 2;
        local_450 = patchSize->width;
        local_44c = patchSize->height;
        local_458 = iVar5;
        if ((((-1 < local_454) && (local_454 + local_44c <= *(int *)(anImage + 8))) && (-1 < iVar5))
           && (iVar5 + local_450 <= *(int *)(anImage + 0xc))) {
          cv::Mat::Mat((Mat *)local_390,anImage,(Rect_ *)&local_458);
          local_3f0[0].sz.width = 0;
          local_3f0[0].sz.height = 0;
          local_3f0[0].flags = 0x2010000;
          local_3f0[0].obj = local_2b8;
          cv::Mat::copyTo((_OutputArray *)local_390);
          LBD_00 = local_400;
          cv::Mat::~Mat((Mat *)local_390);
          fVar9 = patchMean;
          if (patchMean < 0.0) {
            local_3f0[0].sz.width = 0;
            local_3f0[0].sz.height = 0;
            local_3f0[0].flags = 0x1010000;
            local_3f0[0].obj = local_2b8;
            cv::noArray();
            cv::mean((_InputArray *)local_390,local_3f0);
            fVar9 = (float)(double)local_390[0]._M_dataplus._M_p;
          }
          (*(LBD_00->super_LinearOperator)._vptr_LinearOperator[2])(LBD_00,local_2b8,local_f0);
          local_3f8 = *patchSize;
          local_390[0]._M_dataplus._M_p = (pointer)&local_390[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"haar","");
          RealReconstructionWithIHT
                    (local_150,LBD_00,local_f0,iterations,sparsity,&local_3f8,fVar9,2,local_390);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390[0]._M_dataplus._M_p != &local_390[0].field_2) {
            operator_delete(local_390[0]._M_dataplus._M_p,
                            local_390[0].field_2._M_allocated_capacity + 1);
          }
          cv::Mat::Mat((Mat *)local_390,result,(Rect_ *)&local_458);
          local_3f0[0].sz.width = 0;
          local_3f0[0].sz.height = 0;
          local_3f0[0].flags = 0x1010000;
          local_418.sz.width = 0;
          local_418.sz.height = 0;
          local_418.flags = 0x1010000;
          local_418.obj = local_150;
          local_430.super__InputArray.sz.width = 0;
          local_430.super__InputArray.sz.height = 0;
          local_430.super__InputArray.flags = -0x3dff0000;
          local_430.super__InputArray.obj = local_390;
          local_3f0[0].obj = local_390;
          p_Var3 = (_InputArray *)cv::noArray();
          cv::add(local_3f0,&local_418,&local_430,p_Var3,-1);
          cv::Mat::Mat((Mat *)local_3f0,(Mat *)local_318,(Rect_ *)&local_458);
          cv::Mat::operator=((Mat *)local_390,(Mat *)local_3f0);
          cv::Mat::~Mat((Mat *)local_3f0);
          local_3f0[0].sz.width = 0;
          local_3f0[0].sz.height = 0;
          local_3f0[0].flags = 0x1010000;
          local_418.sz.width = 0;
          local_418.sz.height = 0;
          local_418.flags = 0x1010000;
          local_418.obj = local_90;
          local_430.super__InputArray.sz.width = 0;
          local_430.super__InputArray.sz.height = 0;
          local_430.super__InputArray.flags = -0x3dff0000;
          local_430.super__InputArray.obj = local_390;
          local_3f0[0].obj = local_390;
          p_Var3 = (_InputArray *)cv::noArray();
          cv::add(local_3f0,&local_418,&local_430,p_Var3,-1);
          cv::Mat::~Mat((Mat *)local_390);
          pKVar6 = (pointer)local_448._8_8_;
        }
        pKVar7 = pKVar7 + 0x1c;
      } while (pKVar7 != pKVar6);
    }
    finalize(result,(Mat *)local_318[0].sz);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat(local_f0);
    cv::Mat::~Mat((Mat *)local_2b8);
    cv::Mat::~Mat(local_90);
    cv::Mat::~Mat((Mat *)local_318);
    if ((pointer)local_448._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_448._0_8_,(long)local_438 - local_448._0_8_);
    }
    return;
  }
  local_2b8._8_8_ = local_2b8._0_8_;
  local_2b8._0_8_ = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b8,"anImage.type() == CV_32F && anImage.channels() == 1","");
  uVar4 = cv::error(-0xd7,(string *)local_2b8,"PerformRIHTOnImageFAST",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x3a3);
  if ((undefined1 (*) [16])local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,local_2a8[0]._0_8_ + 1);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

void lts2::PerformRIHTOnImageFAST(cv::Mat const &anImage, cv::Size patchSize,
                                 LBDOperator &LBD, cv::Mat &result, int iterations, float sparsity, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);
  
  // Extract FAST keypoints
  std::vector<cv::KeyPoint> fastPoints;
  ExtractFastKeypoints(anImage, fastPoints);
  
  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));
  
  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);
  
  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  int const pradius_x = patchSize.width / 2;
  int const pradius_y = patchSize.height / 2;
  
  std::vector<cv::KeyPoint>::const_iterator p_fast;

  for (p_fast = fastPoints.begin(); p_fast != fastPoints.end(); ++p_fast)
  {
    int x = (int)rintf(p_fast->pt.x) - pradius_x;
    int y = (int)rintf(p_fast->pt.y) - pradius_y;
    
    cv::Rect ROI(x, y, patchSize.width, patchSize.height);
    if ( y < 0 || y+patchSize.height > anImage.rows ||
         x < 0 || x+patchSize.width > anImage.cols )
      continue;

    anImage(ROI).copyTo(inputPatch);
    float pmean = patchMean;
    if (pmean < 0.0)
    {
      cv::Scalar mean = cv::mean(inputPatch);
      pmean = (float)mean[0];
    }

    LBD.Apply(inputPatch, freak);

    lts2::RealReconstructionWithIHT(resultPatch, LBD, freak,
                                    iterations, sparsity, patchSize, pmean);

    cv::Mat target = result(ROI);
    target += resultPatch;

    target = ocount(ROI);
    target += patchOnes;
  }
  
  finalize(result, ocount);
}